

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

span<int,_3UL> __thiscall
nonstd::span_lite::span<int,18446744073709551615ul>::last<3ul>
          (span<int,18446744073709551615ul> *this)

{
  logic_error *this_00;
  size_type extraout_RDX;
  long *in_RSI;
  span<int,_3UL> sVar1;
  span<int,_3UL> local_20;
  
  if (2 < (ulong)in_RSI[1]) {
    span<int,_3UL>::span(&local_20,(pointer)(*in_RSI + in_RSI[1] * 4 + -0xc),3);
    *(pointer *)this = local_20.data_;
    *(size_type *)(this + 8) = local_20.size_;
    sVar1.size_ = extraout_RDX;
    sVar1.data_ = (pointer)this;
    return sVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            ((contract_violation *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1165: Precondition violation."
            );
  std::logic_error::logic_error(this_00,(logic_error *)&local_20);
  *(undefined ***)this_00 = &PTR__logic_error_001b6c70;
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr size_type size() const span_noexcept
    {
        return size_;
    }